

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O1

UChar32 utext_char32At_63(UText *ut,int64_t nativeIndex)

{
  long lVar1;
  int iVar2;
  UChar32 UVar3;
  uint uVar4;
  
  lVar1 = ut->chunkNativeStart;
  uVar4 = 0xffffffff;
  iVar2 = (int)nativeIndex - (int)lVar1;
  if ((lVar1 <= nativeIndex) && (nativeIndex < lVar1 + ut->nativeIndexingLimit)) {
    ut->chunkOffset = iVar2;
    uVar4 = (uint)(ushort)ut->chunkContents[iVar2];
    if ((uVar4 & 0xf800) != 0xd800) {
      return uVar4;
    }
  }
  utext_setNativeIndex_63(ut,nativeIndex);
  if (((ut->chunkNativeStart <= nativeIndex) && (ut->chunkOffset < ut->chunkLength)) &&
     (uVar4 = (uint)(ushort)ut->chunkContents[ut->chunkOffset], (uVar4 & 0xf800) == 0xd800)) {
    UVar3 = utext_current32_63(ut);
    return UVar3;
  }
  return uVar4;
}

Assistant:

U_CAPI UChar32 U_EXPORT2
utext_char32At(UText *ut, int64_t nativeIndex) {
    UChar32 c = U_SENTINEL;

    // Fast path the common case.
    if (nativeIndex>=ut->chunkNativeStart && nativeIndex < ut->chunkNativeStart + ut->nativeIndexingLimit) {
        ut->chunkOffset = (int32_t)(nativeIndex - ut->chunkNativeStart);
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c) == FALSE) {
            return c;
        }
    }


    utext_setNativeIndex(ut, nativeIndex);
    if (nativeIndex>=ut->chunkNativeStart && ut->chunkOffset<ut->chunkLength) {
        c = ut->chunkContents[ut->chunkOffset];
        if (U16_IS_SURROGATE(c)) {
            // For surrogates, let current32() deal with the complications
            //    of supplementaries that may span chunk boundaries.
            c = utext_current32(ut);
        }
    }
    return c;
}